

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall SummedArea_NonCellAligned_Test::TestBody(SummedArea_NonCellAligned_Test *this)

{
  Bounds2f BVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Allocator alloc;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  char *message;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Float FVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Float sampledResult;
  Hammersley2DIter __begin2;
  Bounds2f b;
  AssertionResult gtest_ar;
  double s;
  SummedAreaTable sat;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  float local_d0;
  float local_cc;
  string local_c8;
  Array2D<float> local_a8;
  Bounds2f local_88;
  internal local_78 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  long local_68;
  AssertHelper local_60;
  double local_58;
  Array2D<double> local_50;
  float *__s;
  undefined1 extraout_var_00 [56];
  
  uVar11 = 0x853c49e6748fea9b;
  local_68 = 0;
  do {
    uVar12 = *(ulong *)((long)&DAT_005729a0 + local_68);
    local_a8.allocator.memoryResource = pstd::pmr::new_delete_resource();
    uVar9 = (uint)uVar12;
    local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)uVar9 >> 0x1f & uVar9;
    uVar10 = (uint)(uVar12 >> 0x20);
    uVar7 = 0;
    if (0 < (int)uVar9) {
      uVar7 = uVar12 & 0xffffffff;
    }
    uVar8 = 0;
    if (uVar10 != 0 && -1 < (long)uVar12) {
      uVar8 = (ulong)uVar10;
    }
    local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int> =
         (Tuple2<pbrt::Point2,_int>)(uVar7 | uVar8 << 0x20);
    local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y = (int)uVar10 >> 0x1f & uVar10;
    uVar6 = -uVar9;
    if (0 < (int)uVar9) {
      uVar6 = uVar9;
    }
    uVar9 = -uVar10;
    if (0 < (int)uVar10) {
      uVar9 = uVar10;
    }
    uVar9 = uVar9 * uVar6;
    if (uVar9 == 0) {
      __s = (float *)0x0;
    }
    else {
      iVar4 = (*(local_a8.allocator.memoryResource)->_vptr_memory_resource[2])
                        (local_a8.allocator.memoryResource,(ulong)uVar9 * 4,4);
      __s = (float *)CONCAT44(extraout_var,iVar4);
    }
    local_a8.values = __s;
    if (0 < (int)uVar9) {
      memset(__s,0,(ulong)uVar9 << 2);
    }
    if (local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y <
        local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y) {
      uVar9 = local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
              local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      iVar4 = 0;
      do {
        if (0 < (int)uVar9) {
          uVar7 = 0;
          uVar12 = uVar11;
          do {
            do {
              uVar11 = uVar12 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
              uVar10 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
              bVar5 = (byte)(uVar12 >> 0x3b);
              uVar10 = uVar10 >> bVar5 | uVar10 << 0x20 - bVar5;
              uVar12 = uVar11;
            } while ((int)uVar10 < 0);
            __s[(int)(((int)uVar7 - local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) +
                     (iVar4 - local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) * uVar9)] =
                 (float)((int)uVar10 % 0x20);
            uVar7 = uVar7 + 1;
          } while (uVar7 != uVar9);
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 != local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                        local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
    }
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::SummedAreaTable::SummedAreaTable((SummedAreaTable *)&local_50,&local_a8,alloc);
    uVar12 = uVar11 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    uVar7 = uVar12 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar11;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar12;
    auVar16 = vpunpcklqdq_avx(auVar13,auVar14);
    auVar14 = vpmovsxbq_avx(ZEXT216(0x2d1b));
    auVar13 = vpsrlvq_avx2(auVar16,auVar14);
    auVar23 = vpmovsxbq_avx(ZEXT216(0x1b2d));
    auVar22 = vpsrlvq_avx2(auVar16,auVar23);
    auVar13 = vpshufd_avx(auVar13 ^ auVar22,0xe8);
    auVar16 = vpsrlq_avx(auVar16,0x3b);
    auVar16 = vpshufd_avx(auVar16,0xe8);
    auVar13 = vprorvd_avx512vl(auVar13,auVar16);
    auVar13 = vcvtudq2ps_avx512vl(auVar13);
    auVar16._0_4_ = auVar13._0_4_ * 2.3283064e-10;
    auVar16._4_4_ = auVar13._4_4_ * 2.3283064e-10;
    auVar16._8_4_ = auVar13._8_4_ * 2.3283064e-10;
    auVar16._12_4_ = auVar13._12_4_ * 2.3283064e-10;
    auVar30._8_4_ = 0x3f7fffff;
    auVar30._0_8_ = 0x3f7fffff3f7fffff;
    auVar30._12_4_ = 0x3f7fffff;
    auVar13 = vminps_avx(auVar16,auVar30);
    uVar12 = uVar7 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    uVar11 = uVar12 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar7;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar12;
    auVar16 = vpunpcklqdq_avx(auVar22,auVar27);
    auVar14 = vpsrlvq_avx2(auVar16,auVar14);
    auVar23 = vpsrlvq_avx2(auVar16,auVar23);
    auVar14 = vpshufd_avx(auVar14 ^ auVar23,0xe8);
    auVar23 = vpsrlq_avx(auVar16,0x3b);
    auVar23 = vpshufd_avx(auVar23,0xe8);
    auVar14 = vprorvd_avx512vl(auVar14,auVar23);
    auVar14 = vcvtudq2ps_avx512vl(auVar14);
    auVar23._0_4_ = auVar14._0_4_ * 2.3283064e-10;
    auVar23._4_4_ = auVar14._4_4_ * 2.3283064e-10;
    auVar23._8_4_ = auVar14._8_4_ * 2.3283064e-10;
    auVar23._12_4_ = auVar14._12_4_ * 2.3283064e-10;
    auVar14 = vminps_avx(auVar23,auVar30);
    auVar23 = vminps_avx(auVar14,auVar13);
    auVar13 = vmaxps_avx(auVar14,auVar13);
    BVar1 = (Bounds2f)vmovlhps_avx(auVar23,auVar13);
    local_c8._M_dataplus._M_p = (pointer)0x186a000000000;
    local_d0 = 0.0;
    do {
      local_88 = BVar1;
      auVar21._0_8_ = pbrt::detail::Hammersley2DIter::operator*((Hammersley2DIter *)&local_c8);
      BVar1 = local_88;
      auVar21._8_56_ = extraout_var_00;
      auVar24._8_8_ = 0;
      auVar24._0_4_ = local_88.pMin.super_Tuple2<pbrt::Point2,_float>.x;
      auVar24._4_4_ = local_88.pMin.super_Tuple2<pbrt::Point2,_float>.y;
      local_88.pMax = BVar1.pMax.super_Tuple2<pbrt::Point2,_float>;
      auVar29._8_4_ = 0x3f800000;
      auVar29._0_8_ = 0x3f8000003f800000;
      auVar29._12_4_ = 0x3f800000;
      auVar13 = vsubps_avx(auVar29,auVar21._0_16_);
      auVar17._0_4_ = auVar21._0_4_ * BVar1.pMax.super_Tuple2<pbrt::Point2,_float>.x;
      auVar17._4_4_ = auVar21._4_4_ * BVar1.pMax.super_Tuple2<pbrt::Point2,_float>.y;
      auVar17._8_4_ = extraout_var_00._0_4_ * 0.0;
      auVar17._12_4_ = extraout_var_00._4_4_ * 0.0;
      auVar23 = vfmadd231ps_fma(auVar17,auVar24,auVar13);
      auVar25._8_8_ = 0;
      auVar25._0_4_ = local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
      auVar25._4_4_ = local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
      auVar28._8_8_ = 0;
      auVar28._0_4_ = local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      auVar28._4_4_ = local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
      auVar14 = vpsubd_avx(auVar25,auVar28);
      auVar13 = vcvtdq2ps_avx(auVar14);
      auVar18._0_4_ = (int)(auVar23._0_4_ * auVar13._0_4_);
      auVar18._4_4_ = (int)(auVar23._4_4_ * auVar13._4_4_);
      auVar18._8_4_ = (int)(auVar23._8_4_ * auVar13._8_4_);
      auVar18._12_4_ = (int)(auVar23._12_4_ * auVar13._12_4_);
      auVar23 = vpsubd_avx(auVar18,auVar28);
      auVar13 = vpshufd_avx(auVar23,0x55);
      auVar13 = vpmulld_avx(auVar13,auVar14);
      auVar13 = vpaddd_avx(auVar23,auVar13);
      local_d0 = local_d0 + local_a8.values[auVar13._0_4_];
      iVar4 = (int)local_c8._M_dataplus._M_p + 1;
      local_c8._M_dataplus._M_p._0_4_ = iVar4;
    } while (iVar4 != 100000);
    auVar19._8_8_ = 0;
    auVar19._0_4_ = local_88.pMin.super_Tuple2<pbrt::Point2,_float>.x;
    auVar19._4_4_ = local_88.pMin.super_Tuple2<pbrt::Point2,_float>.y;
    auVar26._8_8_ = 0;
    auVar26._0_4_ = local_88.pMax.super_Tuple2<pbrt::Point2,_float>.x;
    auVar26._4_4_ = local_88.pMax.super_Tuple2<pbrt::Point2,_float>.y;
    auVar14 = vsubps_avx(auVar26,auVar19);
    auVar13 = vmovshdup_avx(auVar14);
    local_cc = (auVar14._0_4_ * auVar13._0_4_ * local_d0) / 100000.0;
    local_88 = BVar1;
    FVar15 = pbrt::SummedAreaTable::Integral((SummedAreaTable *)&local_50,&local_88);
    local_58 = (double)FVar15;
    if ((local_cc != FVar15) || (NAN(local_cc) || NAN(FVar15))) {
      auVar20._0_8_ = ((double)local_cc - local_58) / (double)local_cc;
      auVar20._8_8_ = 0;
      auVar2._8_8_ = 0x7fffffffffffffff;
      auVar2._0_8_ = 0x7fffffffffffffff;
      auVar13 = vandpd_avx512vl(auVar20,auVar2);
      local_c8._M_dataplus._M_p = (pointer)vmovlpd_avx(auVar13);
      local_d8.ptr_._0_4_ = 0x3a83126f;
      testing::internal::CmpHelperLT<double,float>
                (local_78,"std::abs((sampledResult - s) / sampledResult)","1e-3f",
                 (double *)&local_c8,(float *)&local_d8);
      if (local_78[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_d8);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        local_c8._M_string_length = 0;
        local_c8.field_2._M_local_buf[0] = '\0';
        pbrt::detail::stringPrintfRecursive<float&,double&>
                  (&local_c8,"sampled %f s %f",&local_cc,&local_58);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_d8.ptr_ + 0x10),local_c8._M_dataplus._M_p,
                   local_c8._M_string_length);
        message = "";
        if (local_70.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((local_70.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x53d,message);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                   local_c8.field_2._M_local_buf[0]) + 1);
        }
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
          local_d8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    pbrt::Array2D<double>::~Array2D(&local_50);
    pbrt::Array2D<float>::~Array2D(&local_a8);
    local_68 = local_68 + 8;
  } while (local_68 != 0x30);
  return;
}

Assistant:

TEST(SummedArea, NonCellAligned) {
    std::array<int, 2> dims[] = {{1, 6}, {6, 1}, {12, 19}, {16, 16}, {100, 300}, {49, 2}};
    RNG rng;
    for (const auto d : dims) {
        Array2D<Float> v(d[0], d[1]);

        for (int y = 0; y < v.ySize(); ++y)
            for (int x = 0; x < v.xSize(); ++x)
                v(x, y) = rng.Uniform<int>(32);

        SummedAreaTable sat(v);

        Bounds2f b({rng.Uniform<Float>(), rng.Uniform<Float>()},
                   {rng.Uniform<Float>(), rng.Uniform<Float>()});

        Float sampledSum = 0;
        int nSamples = 100000;
        for (Point2f u : Hammersley2D(nSamples)) {
            Point2f p = b.Lerp(u);
            Point2i pi(p.x * v.xSize(), p.y * v.ySize());
            sampledSum += v[pi];
        }
        Float sampledResult = sampledSum * b.Area() / nSamples;

        double s = sat.Integral(b);
        if (sampledResult != s)
            EXPECT_LT(std::abs((sampledResult - s) / sampledResult), 1e-3f)
                << StringPrintf("sampled %f s %f", sampledResult, s);
    }
}